

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread_p.h
# Opt level: O0

bool __thiscall QThreadData::canWaitLocked(QThreadData *this)

{
  byte bVar1;
  QMutex *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutexLocker<QMutex> *this_00;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QMutexLocker<QMutex> *)local_18;
  QMutexLocker<QMutex>::QMutexLocker(this_00,in_RDI);
  bVar1 = *(byte *)((long)&in_RDI[0x11].super_QBasicMutex.d_ptr._q_value._M_b._M_p + 5);
  QMutexLocker<QMutex>::~QMutexLocker(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool canWaitLocked()
    {
        QMutexLocker locker(&postEventList.mutex);
        return canWait;
    }